

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_instance.cpp
# Opt level: O2

ON_ReferencedComponentSettings * __thiscall
ON_ReferencedComponentSettings::operator=
          (ON_ReferencedComponentSettings *this,ON_ReferencedComponentSettings *src)

{
  ON_ReferencedComponentSettingsImpl *pOVar1;
  ON_ReferencedComponentSettingsImpl *src_00;
  
  pOVar1 = this->m_impl;
  src_00 = src->m_impl;
  if (pOVar1 != src_00) {
    if (pOVar1 != (ON_ReferencedComponentSettingsImpl *)0x0) {
      ON_ReferencedComponentSettingsImpl::~ON_ReferencedComponentSettingsImpl(pOVar1);
      operator_delete(pOVar1,0x60);
      src_00 = src->m_impl;
    }
    if (src_00 != (ON_ReferencedComponentSettingsImpl *)0x0) {
      pOVar1 = (ON_ReferencedComponentSettingsImpl *)operator_new(0x60);
      ON_ReferencedComponentSettingsImpl::ON_ReferencedComponentSettingsImpl(pOVar1,src_00);
      this->m_impl = pOVar1;
    }
  }
  return this;
}

Assistant:

ON_ReferencedComponentSettings& ON_ReferencedComponentSettings::operator=(const ON_ReferencedComponentSettings& src)
{
  if (m_impl != src.m_impl)
  {
    if (nullptr != m_impl)
      delete m_impl;
    if (nullptr != src.m_impl)
      m_impl = new ON_ReferencedComponentSettingsImpl(*src.m_impl);
  }
  return *this;
}